

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tld-tree.c
# Opt level: O3

void faup_tld_tree_add_tld(char *tld,void *user_data)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  byte bVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  
  sVar1 = strlen(tld);
  if (*tld == '!') {
    pcVar2 = *(char **)((long)user_data + 8);
    if (pcVar2 != (char *)0x0) goto LAB_00118f68;
    pcVar2 = (char *)calloc(1,0x18);
    *(char **)((long)user_data + 8) = pcVar2;
  }
  else {
    pcVar2 = *(char **)((long)user_data + 0x10);
    if (pcVar2 != (char *)0x0) goto LAB_00118f68;
    pcVar2 = (char *)calloc(1,0x18);
    *(char **)((long)user_data + 0x10) = pcVar2;
  }
  if (pcVar2 == (char *)0x0) {
LAB_00119046:
    fprintf(_stderr,"Error adding the tld \'%s\' to the tree\n",tld);
    return;
  }
  *pcVar2 = '\0';
LAB_00118f68:
  uVar4 = (uint)sVar1;
  if (0 < (int)uVar4) {
    pcVar6 = tld + (uVar4 & 0x7fffffff);
    uVar5 = 0;
    do {
      uVar5 = uVar5 + 1;
      if ((int)uVar5 < (int)uVar4) {
        bVar9 = pcVar6[-2] == '.';
        bVar10 = pcVar6[-2] == '!';
      }
      else {
        bVar9 = false;
        bVar10 = false;
      }
      pcVar6 = pcVar6 + -1;
      if (*(char **)(pcVar2 + 0x10) == (char *)0x0) {
        cVar8 = *pcVar6;
        pcVar3 = (char *)calloc(1,0x18);
        *(char **)(pcVar2 + 0x10) = pcVar3;
LAB_0011900a:
        if (pcVar3 == (char *)0x0) goto LAB_00119046;
        bVar7 = bVar9 | bVar10 | uVar5 == uVar4;
        *pcVar3 = cVar8;
LAB_00119028:
        *(uint *)(pcVar3 + 4) = (uint)bVar7;
        pcVar2 = pcVar3;
      }
      else {
        cVar8 = *pcVar6;
        pcVar3 = *(char **)(pcVar2 + 0x10);
        do {
          pcVar2 = pcVar3;
          if (*(char **)(pcVar2 + 8) == (char *)0x0) {
            if (*pcVar2 != cVar8) {
              pcVar3 = (char *)calloc(1,0x18);
              *(char **)(pcVar2 + 8) = pcVar3;
              goto LAB_0011900a;
            }
            break;
          }
          pcVar3 = *(char **)(pcVar2 + 8);
        } while (*pcVar2 != cVar8);
        bVar7 = 1;
        pcVar3 = pcVar2;
        if ((bVar9 != false || bVar10 != false) || uVar5 == uVar4) goto LAB_00119028;
      }
    } while (uVar5 != uVar4);
  }
  return;
}

Assistant:

static void faup_tld_tree_add_tld(char *tld, void *user_data)
{
	int retval;

	TLDNode *Tree = (TLDNode *)user_data;

	retval = faup_tld_tree_add_node(&Tree, tld, strlen(tld));
	if (retval) {
		fprintf(stderr, "Error adding the tld '%s' to the tree\n", tld);
	}

}